

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::AddDefinition(cmMakefile *this,string *name,char *value)

{
  cmake *pcVar1;
  cmVariableWatch *this_00;
  bool bVar2;
  allocator<char> local_49;
  string local_48;
  
  if (value != (char *)0x0) {
    bVar2 = cmStateSnapshot::IsInitialized(&this->StateSnapshot,name);
    if (bVar2) {
      LogUnused(this,"changing definition",name);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,value,&local_49);
    cmStateSnapshot::SetDefinition(&this->StateSnapshot,name,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    pcVar1 = this->GlobalGenerator->CMakeInstance;
    if ((pcVar1 != (cmake *)0x0) &&
       (this_00 = (pcVar1->VariableWatch)._M_t.
                  super___uniq_ptr_impl<cmVariableWatch,_std::default_delete<cmVariableWatch>_>._M_t
                  .super__Tuple_impl<0UL,_cmVariableWatch_*,_std::default_delete<cmVariableWatch>_>.
                  super__Head_base<0UL,_cmVariableWatch_*,_false>._M_head_impl,
       this_00 != (cmVariableWatch *)0x0)) {
      cmVariableWatch::VariableAccessed(this_00,name,3,value,this);
    }
  }
  return;
}

Assistant:

void cmMakefile::AddDefinition(const std::string& name, const char* value)
{
  if (!value) {
    return;
  }

  if (this->VariableInitialized(name)) {
    this->LogUnused("changing definition", name);
  }
  this->StateSnapshot.SetDefinition(name, value);

#ifdef CMAKE_BUILD_WITH_CMAKE
  cmVariableWatch* vv = this->GetVariableWatch();
  if (vv) {
    vv->VariableAccessed(name, cmVariableWatch::VARIABLE_MODIFIED_ACCESS,
                         value, this);
  }
#endif
}